

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle_BeagleJNIWrapper.cpp
# Opt level: O3

jobjectArray
Java_beagle_BeagleJNIWrapper_getBenchmarkedResourceList
          (JNIEnv *env,jobject obj,jint tipCount,jint compactBufferCount,jint stateCount,
          jint patternCount,jint categoryCount,jintArray inResourceList,jint resourceCount,
          jlong preferenceFlags,jlong requirementFlags,jint eigenModelCount,jint partitionCount,
          jint calculateDerivatives,jlong benchmarkFlags)

{
  jint *pjVar1;
  long *plVar2;
  jclass clazz;
  jmethodID methodID;
  jmethodID methodID_00;
  jmethodID methodID_01;
  jmethodID methodID_02;
  jmethodID methodID_03;
  jmethodID methodID_04;
  jmethodID methodID_05;
  jmethodID methodID_06;
  jmethodID methodID_07;
  jmethodID methodID_08;
  jmethodID methodID_09;
  jobjectArray p_Var3;
  jobject obj_00;
  jstring p_Var4;
  long lVar5;
  char *__s;
  long lVar6;
  
  if (inResourceList == (jintArray)0x0) {
    pjVar1 = (jint *)0x0;
  }
  else {
    pjVar1 = (*env->functions->GetIntArrayElements)(env,inResourceList,(jboolean *)0x0);
  }
  plVar2 = (long *)beagleGetBenchmarkedResourceList
                             (tipCount,compactBufferCount,stateCount,patternCount,categoryCount,
                              pjVar1,resourceCount,preferenceFlags,requirementFlags,eigenModelCount,
                              partitionCount,calculateDerivatives,benchmarkFlags);
  if (plVar2 != (long *)0x0) {
    clazz = (*env->functions->FindClass)(env,"beagle/BenchmarkedResourceDetails");
    if (clazz == (jclass)0x0) {
      __s = "NULL returned in FindClass: can\'t find class: beagle/BenchmarkedResourceDetails";
    }
    else {
      methodID = (*env->functions->GetMethodID)(env,clazz,"<init>","(I)V");
      if (methodID == (jmethodID)0x0) {
        __s = 
        "NULL returned in FindClass: can\'t find constructor for class: beagle/BenchmarkedResourceDetails"
        ;
      }
      else {
        methodID_00 = (*env->functions->GetMethodID)(env,clazz,"setResourceNumber","(I)V");
        if (methodID_00 == (jmethodID)0x0) {
          __s = 
          "NULL returned in FindClass: can\'t find \'setResourceNumber\' method in class: beagle/BenchmarkedResourceDetails"
          ;
        }
        else {
          methodID_01 = (*env->functions->GetMethodID)(env,clazz,"setName","(Ljava/lang/String;)V");
          if (methodID_01 == (jmethodID)0x0) {
            __s = 
            "NULL returned in FindClass: can\'t find \'setName\' method in class: beagle/BenchmarkedResourceDetails"
            ;
          }
          else {
            methodID_02 = (*env->functions->GetMethodID)
                                    (env,clazz,"setDescription","(Ljava/lang/String;)V");
            if (methodID_02 == (jmethodID)0x0) {
              __s = 
              "NULL returned in FindClass: can\'t find \'setDescription\' method in class: beagle/BenchmarkedResourceDetails"
              ;
            }
            else {
              methodID_03 = (*env->functions->GetMethodID)(env,clazz,"setSupportFlags","(J)V");
              if (methodID_03 == (jmethodID)0x0) {
                __s = 
                "NULL returned in FindClass: can\'t find \'setSupportFlags\' method in class: beagle/BenchmarkedResourceDetails"
                ;
              }
              else {
                methodID_04 = (*env->functions->GetMethodID)(env,clazz,"setRequiredFlags","(J)V");
                if (methodID_04 == (jmethodID)0x0) {
                  __s = 
                  "NULL returned in FindClass: can\'t find \'setRequiredFlags\' method in class: beagle/BenchmarkedResourceDetails"
                  ;
                }
                else {
                  methodID_05 = (*env->functions->GetMethodID)(env,clazz,"setReturnCode","(I)V");
                  if (methodID_05 == (jmethodID)0x0) {
                    __s = 
                    "NULL returned in FindClass: can\'t find \'setReturnCode\' method in class: beagle/BenchmarkedResourceDetails"
                    ;
                  }
                  else {
                    methodID_06 = (*env->functions->GetMethodID)
                                            (env,clazz,"setImplName","(Ljava/lang/String;)V");
                    if (methodID_06 == (jmethodID)0x0) {
                      __s = 
                      "NULL returned in FindClass: can\'t find \'setImplName\' method in class: beagle/BenchmarkedResourceDetails"
                      ;
                    }
                    else {
                      methodID_07 = (*env->functions->GetMethodID)
                                              (env,clazz,"setBenchedFlags","(J)V");
                      if (methodID_07 == (jmethodID)0x0) {
                        __s = 
                        "NULL returned in FindClass: can\'t find \'setBenchedFlags\' method in class: beagle/BenchmarkedResourceDetails"
                        ;
                      }
                      else {
                        methodID_08 = (*env->functions->GetMethodID)
                                                (env,clazz,"setBenchmarkResult","(D)V");
                        if (methodID_08 == (jmethodID)0x0) {
                          __s = 
                          "NULL returned in FindClass: can\'t find \'setBenchmarkResult\' method in class: beagle/BenchmarkedResourceDetails"
                          ;
                        }
                        else {
                          methodID_09 = (*env->functions->GetMethodID)
                                                  (env,clazz,"setPerformanceRatio","(D)V");
                          if (methodID_09 != (jmethodID)0x0) {
                            p_Var3 = (*env->functions->NewObjectArray)
                                               (env,(jsize)plVar2[1],clazz,(jobject)0x0);
                            if ((int)plVar2[1] < 1) {
                              return p_Var3;
                            }
                            lVar6 = 0;
                            lVar5 = 0;
                            do {
                              obj_00 = JNIEnv_::NewObject(env,clazz,methodID,lVar5);
                              JNIEnv_::CallVoidMethod
                                        (env,obj_00,methodID_00,(ulong)*(uint *)(*plVar2 + lVar6));
                              p_Var4 = (*env->functions->NewStringUTF)
                                                 (env,*(char **)(*plVar2 + 8 + lVar6));
                              JNIEnv_::CallVoidMethod(env,obj_00,methodID_01,p_Var4);
                              p_Var4 = (*env->functions->NewStringUTF)
                                                 (env,*(char **)(*plVar2 + 0x10 + lVar6));
                              JNIEnv_::CallVoidMethod(env,obj_00,methodID_02,p_Var4);
                              JNIEnv_::CallVoidMethod
                                        (env,obj_00,methodID_03,
                                         *(undefined8 *)(*plVar2 + 0x18 + lVar6));
                              JNIEnv_::CallVoidMethod
                                        (env,obj_00,methodID_04,
                                         *(undefined8 *)(*plVar2 + 0x20 + lVar6));
                              JNIEnv_::CallVoidMethod
                                        (env,obj_00,methodID_05,
                                         (ulong)*(uint *)(*plVar2 + 0x28 + lVar6));
                              p_Var4 = (*env->functions->NewStringUTF)
                                                 (env,*(char **)(*plVar2 + 0x30 + lVar6));
                              JNIEnv_::CallVoidMethod(env,obj_00,methodID_06,p_Var4);
                              JNIEnv_::CallVoidMethod
                                        (env,obj_00,methodID_07,
                                         *(undefined8 *)(*plVar2 + 0x38 + lVar6));
                              JNIEnv_::CallVoidMethod
                                        (env,obj_00,methodID_08,
                                         *(undefined8 *)(*plVar2 + 0x40 + lVar6));
                              JNIEnv_::CallVoidMethod
                                        (env,obj_00,methodID_09,
                                         *(undefined8 *)(*plVar2 + 0x48 + lVar6));
                              (*env->functions->SetObjectArrayElement)
                                        (env,p_Var3,(jsize)lVar5,obj_00);
                              lVar6 = lVar6 + 0x50;
                              lVar5 = lVar5 + 1;
                            } while (lVar5 < (int)plVar2[1]);
                            return p_Var3;
                          }
                          __s = 
                          "NULL returned in FindClass: can\'t find \'setPerformanceRatio\' method in class: beagle/BenchmarkedResourceDetails"
                          ;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    puts(__s);
  }
  return (jobjectArray)0x0;
}

Assistant:

JNIEXPORT jobjectArray JNICALL Java_beagle_BeagleJNIWrapper_getBenchmarkedResourceList
  (JNIEnv *env, jobject obj, jint tipCount, jint compactBufferCount, jint stateCount, jint patternCount, jint categoryCount, jintArray inResourceList, jint resourceCount, jlong preferenceFlags, jlong requirementFlags, jint eigenModelCount, jint partitionCount, jint calculateDerivatives, jlong benchmarkFlags)
{

    jint *resourceList = NULL;
    if (inResourceList != NULL)
        resourceList = env->GetIntArrayElements(inResourceList, NULL);

    BeagleBenchmarkedResourceList* brl =  beagleGetBenchmarkedResourceList(tipCount,
                                                               compactBufferCount,
                                                               stateCount,
                                                               patternCount,
                                                               categoryCount,
                                                               (int *)resourceList,
                                                               resourceCount,
                                                               preferenceFlags,
                                                               requirementFlags,
                                                               eigenModelCount,
                                                               partitionCount,
                                                               calculateDerivatives,
                                                               benchmarkFlags);

    if (brl == NULL) {
        return NULL;
    }

    jclass objClass = env->FindClass("beagle/BenchmarkedResourceDetails");
    if (objClass == NULL) {
        printf("NULL returned in FindClass: can't find class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID constructorMethodID = env->GetMethodID(objClass, "<init>","(I)V");
    if (constructorMethodID == NULL) {
        printf("NULL returned in FindClass: can't find constructor for class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setResourceNumberMethodID = env->GetMethodID(objClass, "setResourceNumber", "(I)V");
    if (setResourceNumberMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setResourceNumber' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setNameMethodID = env->GetMethodID(objClass, "setName", "(Ljava/lang/String;)V");
    if (setNameMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setName' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setDescriptionMethodID = env->GetMethodID(objClass, "setDescription", "(Ljava/lang/String;)V");
    if (setDescriptionMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setDescription' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setSupportFlagsMethodID = env->GetMethodID(objClass, "setSupportFlags", "(J)V");
    if (setSupportFlagsMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setSupportFlags' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setRequiredFlagsMethodID = env->GetMethodID(objClass, "setRequiredFlags", "(J)V");
    if (setRequiredFlagsMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setRequiredFlags' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setReturnCodeMethodID = env->GetMethodID(objClass, "setReturnCode", "(I)V");
    if (setReturnCodeMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setReturnCode' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setImplNameMethodID = env->GetMethodID(objClass, "setImplName", "(Ljava/lang/String;)V");
    if (setImplNameMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setImplName' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setBenchedFlagsMethodID = env->GetMethodID(objClass, "setBenchedFlags", "(J)V");
    if (setBenchedFlagsMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setBenchedFlags' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setBenchmarkResultMethodID = env->GetMethodID(objClass, "setBenchmarkResult", "(D)V");
    if (setBenchmarkResultMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setBenchmarkResult' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jmethodID setPerformanceRatioMethodID = env->GetMethodID(objClass, "setPerformanceRatio", "(D)V");
    if (setPerformanceRatioMethodID == NULL) {
        printf("NULL returned in FindClass: can't find 'setPerformanceRatio' method in class: beagle/BenchmarkedResourceDetails\n");
        return NULL;
    }

    jobjectArray benchmarkedResourceArray = env->NewObjectArray(brl->length, objClass, NULL);

    for (int i = 0; i < brl->length; i++) {
        jobject benchmarkedResourceObj = env->NewObject(objClass, constructorMethodID, i);

        env->CallVoidMethod(benchmarkedResourceObj, setResourceNumberMethodID, brl->list[i].number);

        jstring jString = env->NewStringUTF(brl->list[i].name);
        env->CallVoidMethod(benchmarkedResourceObj, setNameMethodID, jString);

        jString = env->NewStringUTF(brl->list[i].description);
        env->CallVoidMethod(benchmarkedResourceObj, setDescriptionMethodID, jString);

        env->CallVoidMethod(benchmarkedResourceObj, setSupportFlagsMethodID, brl->list[i].supportFlags);

        env->CallVoidMethod(benchmarkedResourceObj, setRequiredFlagsMethodID, brl->list[i].requiredFlags);

        env->CallVoidMethod(benchmarkedResourceObj, setReturnCodeMethodID, brl->list[i].returnCode);

        jString = env->NewStringUTF(brl->list[i].implName);
        env->CallVoidMethod(benchmarkedResourceObj, setImplNameMethodID, jString);

        env->CallVoidMethod(benchmarkedResourceObj, setBenchedFlagsMethodID, brl->list[i].benchedFlags);

        env->CallVoidMethod(benchmarkedResourceObj, setBenchmarkResultMethodID, brl->list[i].benchmarkResult);

        env->CallVoidMethod(benchmarkedResourceObj, setPerformanceRatioMethodID, brl->list[i].performanceRatio);

        env->SetObjectArrayElement(benchmarkedResourceArray, i, benchmarkedResourceObj);
    }

    return benchmarkedResourceArray;
}